

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_types.cpp
# Opt level: O1

vector<duckdb::TestType,_true> *
duckdb::TestAllTypesFun::GetTestTypes
          (vector<duckdb::TestType,_true> *__return_storage_ptr__,bool use_large_enum)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  undefined1 auVar3 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> **pp_Var4;
  char cVar5;
  date_t value;
  undefined8 *puVar6;
  timestamp_t value_00;
  timestamp_tz_t value_01;
  LogicalType *pLVar7;
  ulong in_RCX;
  Value *pVVar8;
  undefined8 *puVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long lVar12;
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar13;
  char cVar14;
  undefined7 in_register_00000031;
  undefined8 uVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  ulong uVar17;
  initializer_list<duckdb::Value> __l;
  initializer_list<duckdb::Value> __l_00;
  initializer_list<duckdb::Value> __l_01;
  initializer_list<duckdb::Value> __l_02;
  initializer_list<duckdb::Value> __l_03;
  initializer_list<duckdb::Value> __l_04;
  initializer_list<duckdb::Value> __l_05;
  initializer_list<duckdb::Value> __l_06;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_07;
  initializer_list<duckdb::Value> __l_08;
  initializer_list<duckdb::Value> __l_09;
  initializer_list<duckdb::Value> __l_10;
  initializer_list<duckdb::Value> __l_11;
  initializer_list<duckdb::Value> __l_12;
  initializer_list<duckdb::Value> __l_13;
  initializer_list<duckdb::Value> __l_14;
  initializer_list<duckdb::Value> __l_15;
  initializer_list<duckdb::Value> __l_16;
  initializer_list<duckdb::Value> __l_17;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>
  __l_18;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l_19;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>
  __l_20;
  initializer_list<duckdb::Value> __l_21;
  initializer_list<duckdb::Value> __l_22;
  initializer_list<duckdb::Value> __l_23;
  initializer_list<duckdb::Value> __l_24;
  anon_struct_16_3_d7536bce_for_pointer aVar18;
  string_t sVar19;
  interval_t interval;
  string_t data;
  string_t data_00;
  string_t data_01;
  string_t data_02;
  string_t data_03;
  Value max_map_value;
  Vector large_enum;
  Value empty_int_list;
  Value int_list;
  LogicalType int_list_type;
  LogicalType fixed_int_array_type;
  LogicalType struct_type;
  child_list_t<Value> max_struct_vl_list;
  child_list_t<Value> min_struct_vl_list;
  child_list_t<Value> max_struct_list;
  child_list_t<Value> min_struct_list;
  LogicalType fixed_varchar_array_type;
  vector<duckdb::Value,_true> map_values;
  child_list_t<Value> map_struct2;
  child_list_t<Value> map_struct1;
  child_list_t<LogicalType> struct_list_type_list;
  child_list_t<LogicalType> struct_type_list;
  Value max_struct_val;
  child_list_t<LogicalType> members;
  LogicalType map_type;
  Value min_struct_val_list;
  Value min_struct_val;
  LogicalType varchar_list_type;
  Vector small_enum;
  Value fixed_int_max_array_value;
  Value fixed_varchar_min_array_value;
  Value fixed_varchar_max_array_value;
  Vector medium_enum;
  Value fixed_int_min_array_value;
  LogicalType list_of_fixed_array_of_int_type;
  LogicalType fixed_array_of_list_of_int_type;
  LogicalType struct_of_fixed_array_type;
  LogicalType fixed_struct_array_type;
  LogicalType fixed_nested_varchar_array_type;
  LogicalType fixed_nested_int_array_type;
  LogicalType union_type;
  LogicalType array_of_structs_type;
  LogicalType struct_list_type;
  LogicalType nested_list_type;
  LogicalType timestamptz_list_type;
  LogicalType timestamp_list_type;
  LogicalType date_list_type;
  LogicalType double_list_type;
  Value fixed_nested_int_min_array_value;
  Value max_struct_val_list;
  Value empty_varchar_list;
  Value empty_timestamptz_list;
  Value empty_timestamp_list;
  Value struct_of_fixed_array_min_value;
  Value fixed_nested_int_max_array_value;
  Value varchar_list;
  Value list_of_fixed_array_of_int_max_value;
  Value list_of_fixed_array_of_int_min_value;
  Value fixed_array_of_list_of_int_max_value;
  Value fixed_array_of_list_of_int_min_value;
  Value struct_of_fixed_array_max_value;
  Value fixed_struct_max_array_value;
  Value fixed_struct_min_array_value;
  Value fixed_nested_varchar_max_array_value;
  Value fixed_nested_varchar_min_array_value;
  Value empty_nested_list;
  Value timestamptz_list;
  Value timestamp_list;
  Value empty_date_list;
  Value empty_double_list;
  Value min_map_value;
  Value max_array_of_struct_val;
  Value min_array_of_struct_val;
  Value nested_int_list;
  Value date_list;
  Value double_list;
  uint8_t in_stack_ffffffffffffe89d;
  uint8_t in_stack_ffffffffffffe89e;
  undefined1 local_1758 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1748 [3];
  undefined1 local_1710 [8];
  LogicalType local_1708;
  Val local_16f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_16d8;
  undefined1 local_16d0 [32];
  Val local_16b0 [2];
  Value local_1690;
  Value local_1650;
  Value local_1610;
  Value local_15d0;
  allocator_type local_1589;
  Value local_1588;
  Value local_1548;
  LogicalType local_1508;
  LogicalType local_14f0;
  uint local_14d8;
  undefined4 uStack_14d4;
  undefined4 uStack_14d0;
  undefined4 uStack_14cc;
  uint local_14c8;
  undefined4 uStack_14c4;
  undefined4 uStack_14c0;
  undefined4 uStack_14bc;
  undefined4 local_14b4;
  LogicalType local_14b0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1498;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1478;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1458;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1438;
  LogicalType local_1420;
  uint local_1408;
  undefined4 uStack_1404;
  undefined4 uStack_1400;
  undefined4 uStack_13fc;
  uint local_13f8;
  undefined4 uStack_13f4;
  undefined4 uStack_13f0;
  undefined4 uStack_13ec;
  Value local_13e8;
  vector<duckdb::Value,_std::allocator<duckdb::Value>_> local_13a8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1388;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_1368;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_1348;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_1328;
  Value local_1310;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_12d0;
  LogicalType local_12b8;
  Value local_12a0;
  Value local_1260;
  LogicalType local_1220;
  undefined1 local_1208 [56];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_11d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_11b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_11a8;
  Value local_11a0;
  Value local_1160;
  Value local_1120;
  Vector local_10e0;
  Value local_1078;
  vector<duckdb::Value,_true> local_1038;
  vector<duckdb::Value,_true> local_1020;
  LogicalType local_1008;
  vector<duckdb::Value,_true> local_ff0;
  vector<duckdb::Value,_true> local_fd8;
  LogicalType local_fc0;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_fa8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_f90;
  child_list_t<LogicalType> local_f78;
  LogicalType local_f60;
  vector<duckdb::Value,_true> local_f48;
  vector<duckdb::Value,_true> local_f30;
  LogicalType local_f18;
  vector<duckdb::Value,_true> local_f00;
  LogicalType local_ee8;
  vector<duckdb::Value,_true> local_ed0;
  LogicalType local_eb8;
  vector<duckdb::Value,_true> local_ea0;
  LogicalType local_e88;
  vector<duckdb::Value,_true> local_e70;
  LogicalType local_e58;
  vector<duckdb::Value,_true> local_e40;
  LogicalType local_e28;
  vector<duckdb::Value,_true> local_e10;
  vector<duckdb::Value,_true> local_df8;
  LogicalType local_de0;
  vector<duckdb::Value,_true> local_dc8;
  child_list_t<LogicalType> local_db0;
  child_list_t<LogicalType> local_d98;
  child_list_t<LogicalType> local_d80;
  LogicalType local_d68;
  vector<duckdb::Value,_true> local_d50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_d38;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_d20;
  LogicalType local_d08;
  LogicalType local_cf0;
  LogicalType local_cd8;
  vector<duckdb::Value,_true> local_cc0;
  LogicalType local_ca8;
  LogicalType local_c90;
  LogicalType local_c78;
  child_list_t<LogicalType> local_c60;
  LogicalType local_c48;
  LogicalType local_c30;
  LogicalType local_c18;
  child_list_t<LogicalType> local_c00;
  LogicalType local_be8;
  vector<duckdb::Value,_true> local_bd0;
  LogicalType local_bb8;
  LogicalType local_ba0;
  vector<duckdb::Value,_true> local_b88;
  LogicalType local_b70;
  vector<duckdb::Value,_true> local_b58;
  LogicalType local_b40;
  LogicalType local_b28;
  vector<duckdb::Value,_true> local_b10;
  LogicalType local_af8;
  LogicalType local_ae0;
  vector<duckdb::Value,_true> local_ac8;
  LogicalType local_ab0;
  LogicalType local_a98;
  vector<duckdb::Value,_true> local_a80;
  LogicalType local_a68;
  LogicalType local_a50;
  LogicalType local_a38;
  vector<duckdb::Value,_true> local_a20;
  LogicalType local_a08;
  LogicalType local_9f0;
  LogicalType local_9d8;
  LogicalType local_9c0;
  Value local_9a8;
  vector<duckdb::Value,_true> local_968;
  vector<duckdb::Value,_true> local_948;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_928;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_908;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_8e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  local_8c8;
  vector<duckdb::Value,_true> local_8a8;
  vector<duckdb::Value,_true> local_888;
  vector<duckdb::Value,_true> local_868;
  vector<duckdb::Value,_true> local_848;
  vector<duckdb::Value,_true> local_828;
  vector<duckdb::Value,_true> local_808;
  vector<duckdb::Value,_true> local_7e8;
  Value local_7d0;
  Value local_790;
  Value local_750;
  Value local_710;
  Value local_6d0;
  string local_690;
  Value local_670;
  Value local_630;
  Value local_5f0;
  Value local_5b0;
  Value local_570;
  Value local_530;
  Value local_4f0;
  Value local_4b0;
  Value local_470;
  Value local_430;
  Value local_3f0;
  Value local_3b0;
  Value local_370;
  Value local_330;
  Value local_2f0;
  Value local_2b0;
  Value local_270;
  Value local_230;
  Value local_1f0;
  Value local_1b0;
  Value local_170;
  Value local_130;
  Value local_f0;
  Value local_b0;
  Value local_70;
  
  (__return_storage_ptr__->super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>).
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>).
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super_vector<duckdb::TestType,_std::allocator<duckdb::TestType>_>).
  super__Vector_base<duckdb::TestType,_std::allocator<duckdb::TestType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BOOLEAN,(char (*) [5])0x1df0036);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TINYINT,(char (*) [8])0x1dec052);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::SMALLINT,(char (*) [9])0x1dec0ed);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[4]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::INTEGER,(char (*) [4])0x1e12b0e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BIGINT,(char (*) [7])0x1dec079);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::HUGEINT,(char (*) [8])0x1debfc2);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UHUGEINT,(char (*) [9])0x1dec13c);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UTINYINT,(char (*) [9])0x1dec051);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[10]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::USMALLINT,(char (*) [10])0x1dec02c);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UINTEGER,(char (*) [5])"uint");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UBIGINT,(char (*) [8])0x1debfe5);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::VARINT,(char (*) [7])"varint");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::DATE,(char (*) [5])0x1f15fb6);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIME,(char (*) [5])0x1dd5a47);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[10]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP,(char (*) [10])0x1f1584d);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[12]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_S,(char (*) [12])"timestamp_s");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_MS,(char (*) [13])"timestamp_ms");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_NS,(char (*) [13])0x1f16156);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIME_TZ,(char (*) [8])"time_tz");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[13]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::TIMESTAMP_TZ,(char (*) [13])"timestamp_tz");
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[6]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::FLOAT,(char (*) [6])0x1e12b6e);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[7]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::DOUBLE,(char (*) [7])0x1f0dfcc);
  LogicalType::DECIMAL(in_stack_ffffffffffffe89e,in_stack_ffffffffffffe89d);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)local_1710,(char (*) [8])"dec_4_1");
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::DECIMAL(in_stack_ffffffffffffe89e,in_stack_ffffffffffffe89d);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[8]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)local_1710,(char (*) [8])"dec_9_4");
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::DECIMAL(in_stack_ffffffffffffe89e,in_stack_ffffffffffffe89d);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)local_1710,(char (*) [9])"dec_18_6");
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::DECIMAL(in_stack_ffffffffffffe89e,in_stack_ffffffffffffe89d);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[9]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)local_1710,(char (*) [9])"dec38_10");
  LogicalType::~LogicalType((LogicalType *)local_1710);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::UUID,(char (*) [5])0x1e0fa14);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RCX;
  Value::INTERVAL((Value *)local_1710,(Value *)0x0,(interval_t)(auVar3 << 0x40));
  interval.micros = in_RCX;
  interval.months = 999999999;
  interval.days = 0;
  Value::INTERVAL((Value *)local_1208,(Value *)0x3e7000003e7,interval);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[9],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::INTERVAL,(char (*) [9])0x1df1060,(Value *)local_1710,(Value *)local_1208)
  ;
  Value::~Value((Value *)local_1208);
  Value::~Value((Value *)local_1710);
  Value::Value((Value *)local_1710,anon_var_dwarf_1ae4f39);
  local_690.field_2._M_allocated_capacity._0_4_ = 0x6f6f67;
  local_690.field_2._M_allocated_capacity._4_2_ = 0x6573;
  local_690._M_string_length = 6;
  local_690.field_2._M_local_buf[6] = '\0';
  local_690._M_dataplus._M_p = (pointer)&local_690.field_2;
  Value::Value((Value *)local_1208,&local_690);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[8],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::VARCHAR,(char (*) [8])0x1dc6196,(Value *)local_1710,(Value *)local_1208);
  Value::~Value((Value *)local_1208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690._M_dataplus._M_p != &local_690.field_2) {
    operator_delete(local_690._M_dataplus._M_p);
  }
  Value::~Value((Value *)local_1710);
  lVar12 = (long)&local_10e0.type.type_info_;
  local_10e0._0_8_ = lVar12;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_10e0,"thisisalongblob\\x00withnullbytes","");
  Value::BLOB((Value *)local_1710,(string *)&local_10e0);
  local_1758._0_8_ = local_1748;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1758,"\\x00\\x00\\x00a","");
  Value::BLOB((Value *)local_1208,(string *)local_1758);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[5],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BLOB,(char (*) [5])0x1e1df7a,(Value *)local_1710,(Value *)local_1208);
  Value::~Value((Value *)local_1208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._0_8_ != local_1748) {
    operator_delete((void *)local_1758._0_8_);
  }
  Value::~Value((Value *)local_1710);
  if (local_10e0._0_8_ != lVar12) {
    operator_delete((void *)local_10e0._0_8_);
  }
  local_10e0._0_8_ = lVar12;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_10e0,"0010001001011100010101011010111","");
  Value::BIT((Value *)local_1710,(string *)&local_10e0);
  local_1758._0_8_ = local_1748;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1758,"10101","");
  Value::BIT((Value *)local_1208,(string *)local_1758);
  pVVar8 = (Value *)local_1710;
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalTypeId_const&,char_const(&)[4],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &LogicalType::BIT,(char (*) [4])0x1ea8b76,pVVar8,(Value *)local_1208);
  Value::~Value((Value *)local_1208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._0_8_ != local_1748) {
    operator_delete((void *)local_1758._0_8_);
  }
  Value::~Value((Value *)local_1710);
  if (local_10e0._0_8_ != lVar12) {
    operator_delete((void *)local_10e0._0_8_);
  }
  LogicalType::LogicalType(&local_9c0,VARCHAR);
  Vector::Vector((Vector *)local_1208,&local_9c0,2);
  LogicalType::~LogicalType(&local_9c0);
  sVar19.value.pointer.ptr = (char *)pVVar8;
  sVar19.value._0_8_ = "DUCK_DUCK_ENUM";
  aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)local_1208,(Vector *)0x4b4355440000000e,sVar19);
  *(anon_struct_16_3_d7536bce_for_pointer *)local_1208._32_8_ = aVar18;
  data.value.pointer.ptr = (char *)pVVar8;
  data.value._0_8_ = 0x45;
  aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)local_1208,(Vector *)0x534f4f4700000005,data);
  ((anon_union_16_2_67f50693_for_value *)(local_1208._32_8_ + 0x10))->pointer = aVar18;
  LogicalType::ENUM((LogicalType *)local_1710,(Vector *)local_1208,2);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[11]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)local_1710,(char (*) [11])"small_enum");
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType(&local_9d8,VARCHAR);
  local_14b4 = (undefined4)CONCAT71(in_register_00000031,use_large_enum);
  Vector::Vector(&local_10e0,&local_9d8,300);
  LogicalType::~LogicalType(&local_9d8);
  uVar17 = 0;
  do {
    local_1758._0_8_ = local_1748;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1758,"enum_","");
    cVar14 = '\x01';
    if (9 < uVar17) {
      uVar10 = uVar17;
      cVar5 = '\x04';
      do {
        cVar14 = cVar5;
        if (uVar10 < 100) {
          cVar14 = cVar14 + -2;
          goto LAB_01163450;
        }
        if (uVar10 < 1000) {
          cVar14 = cVar14 + -1;
          goto LAB_01163450;
        }
        if (uVar10 < 10000) goto LAB_01163450;
        bVar2 = 99999 < uVar10;
        uVar10 = uVar10 / 10000;
        cVar5 = cVar14 + '\x04';
      } while (bVar2);
      cVar14 = cVar14 + '\x01';
    }
LAB_01163450:
    local_1588.type_._0_8_ =
         &local_1588.type_.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    ::std::__cxx11::string::_M_construct((ulong)&local_1588,cVar14);
    ::std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_1588.type_._0_8_,
               (uint)local_1588.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               uVar17);
    uVar15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1758._0_8_ != local_1748) {
      uVar15 = local_1748[0]._M_allocated_capacity;
    }
    p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)(_func_int ***)local_1758._8_8_ +
             CONCAT44(local_1588.type_.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                      _4_4_,(uint)local_1588.type_.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr));
    if ((ulong)uVar15 < p_Var1) {
      _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
          &local_1588.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        _Var16._M_pi = local_1588.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
      if (_Var16._M_pi < p_Var1) goto LAB_011634d6;
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::replace((ulong)&local_1588,0,(char *)0x0,local_1758._0_8_);
    }
    else {
LAB_011634d6:
      puVar6 = (undefined8 *)
               ::std::__cxx11::string::_M_append((char *)local_1758,local_1588.type_._0_8_);
    }
    local_1710 = (undefined1  [8])&local_1708.type_info_;
    puVar9 = puVar6 + 2;
    if ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)*puVar6 ==
        (shared_ptr<duckdb::ExtraTypeInfo,_true> *)puVar9) {
      local_1708.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*puVar9;
      local_1708.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[3];
    }
    else {
      local_1708.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)*puVar9;
      local_1710 = (undefined1  [8])*puVar6;
    }
    local_1708._0_8_ = puVar6[1];
    *puVar6 = puVar9;
    puVar6[1] = 0;
    *(undefined1 *)puVar9 = 0;
    local_13f8 = (uint)local_1708._0_8_;
    if (local_13f8 < 0xd) {
      uStack_13ec = 0;
      uStack_13f4 = 0;
      uStack_13f0 = 0;
      if (local_13f8 != 0) {
        switchD_012dd528::default(&uStack_13f4,(void *)local_1710,(ulong)(local_13f8 & 0xf));
      }
    }
    else {
      uStack_13f4 = *(undefined4 *)local_1710;
      uStack_13f0 = local_1710._0_4_;
      uStack_13ec = local_1710._4_4_;
    }
    data_00.value._4_1_ = (undefined1)uStack_13ec;
    data_00.value._5_1_ = uStack_13ec._1_1_;
    data_00.value._6_1_ = uStack_13ec._2_1_;
    data_00.value._7_1_ = uStack_13ec._3_1_;
    data_00.value.pointer.length = uStack_13f0;
    data_00.value.pointer.ptr = (char *)puVar9;
    sVar19 = StringVector::AddStringOrBlob
                       ((StringVector *)&local_10e0,(Vector *)CONCAT44(uStack_13f4,local_13f8),
                        data_00);
    *(long *)(local_10e0.data + uVar17 * 0x10) = sVar19.value._0_8_;
    *(long *)(local_10e0.data + uVar17 * 0x10 + 8) = sVar19.value._8_8_;
    if (local_1710 != (undefined1  [8])&local_1708.type_info_) {
      operator_delete((void *)local_1710);
    }
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
        &local_1588.type_.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
      operator_delete((void *)local_1588.type_._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1758._0_8_ != local_1748) {
      operator_delete((void *)local_1758._0_8_);
    }
    uVar17 = uVar17 + 1;
  } while (uVar17 != 300);
  LogicalType::ENUM((LogicalType *)local_1710,&local_10e0,300);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[12]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)local_1710,(char (*) [12])"medium_enum");
  LogicalType::~LogicalType((LogicalType *)local_1710);
  if ((char)local_14b4 != '\0') {
    LogicalType::LogicalType(&local_9f0,VARCHAR);
    Vector::Vector((Vector *)local_1710,&local_9f0,70000);
    LogicalType::~LogicalType(&local_9f0);
    pp_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
              &local_1548.type_.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    uVar17 = 0;
    do {
      local_1588.type_._0_8_ =
           &local_1588.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1588,"enum_","");
      cVar14 = '\x01';
      if (9 < uVar17) {
        uVar10 = uVar17;
        cVar5 = '\x04';
        do {
          cVar14 = cVar5;
          if (uVar10 < 100) {
            cVar14 = cVar14 + -2;
            goto LAB_01163725;
          }
          if (uVar10 < 1000) {
            cVar14 = cVar14 + -1;
            goto LAB_01163725;
          }
          if (uVar10 < 10000) goto LAB_01163725;
          bVar2 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar5 = cVar14 + '\x04';
        } while (bVar2);
        cVar14 = cVar14 + '\x01';
      }
LAB_01163725:
      local_1548.type_._0_8_ = pp_Var4;
      ::std::__cxx11::string::_M_construct((ulong)&local_1548,cVar14);
      ::std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_1548.type_._0_8_,
                 (uint)local_1548.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 uVar17);
      _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
          &local_1588.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        _Var16._M_pi = local_1588.type_.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
      }
      p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (CONCAT44(local_1548.type_.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr._4_4_,
                         (uint)local_1548.type_.type_info_.internal.
                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr) +
               CONCAT44(local_1588.type_.type_info_.internal.
                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                        ._4_4_,(uint)local_1588.type_.type_info_.internal.
                                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr));
      if (_Var16._M_pi < p_Var1) {
        _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1548.type_._0_8_ != pp_Var4) {
          _Var16._M_pi = local_1548.type_.type_info_.internal.
                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
        }
        if (_Var16._M_pi < p_Var1) goto LAB_011637ac;
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::replace
                           ((ulong)&local_1548,0,(char *)0x0,local_1588.type_._0_8_);
      }
      else {
LAB_011637ac:
        puVar6 = (undefined8 *)
                 ::std::__cxx11::string::_M_append((char *)&local_1588,local_1548.type_._0_8_);
      }
      local_1758._0_8_ = local_1748;
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 == paVar11) {
        local_1748[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_1748[0]._8_8_ = puVar6[3];
      }
      else {
        local_1748[0]._0_8_ = paVar11->_M_allocated_capacity;
        local_1758._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar6;
      }
      local_1758._8_8_ = puVar6[1];
      *puVar6 = paVar11;
      puVar6[1] = 0;
      paVar11->_M_local_buf[0] = '\0';
      local_1408 = (uint)local_1758._8_8_;
      if (local_1408 < 0xd) {
        uStack_13fc = 0;
        uStack_1404 = 0;
        uStack_1400 = 0;
        if (local_1408 != 0) {
          switchD_012dd528::default(&uStack_1404,(void *)local_1758._0_8_,(ulong)(local_1408 & 0xf))
          ;
        }
      }
      else {
        uStack_1404 = *(undefined4 *)local_1758._0_8_;
        uStack_1400 = (undefined4)local_1758._0_8_;
        uStack_13fc = SUB84(local_1758._0_8_,4);
      }
      data_01.value._4_1_ = (undefined1)uStack_13fc;
      data_01.value._5_1_ = uStack_13fc._1_1_;
      data_01.value._6_1_ = uStack_13fc._2_1_;
      data_01.value._7_1_ = uStack_13fc._3_1_;
      data_01.value.pointer.length = uStack_1400;
      data_01.value.pointer.ptr = (char *)paVar11;
      sVar19 = StringVector::AddStringOrBlob
                         ((StringVector *)local_1710,(Vector *)CONCAT44(uStack_1404,local_1408),
                          data_01);
      *(long *)(local_16f0.bigint + uVar17 * 0x10) = sVar19.value._0_8_;
      ((char **)(local_16f0.bigint + 8))[uVar17 * 2] = sVar19.value._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1758._0_8_ != local_1748) {
        operator_delete((void *)local_1758._0_8_);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1548.type_._0_8_ != pp_Var4) {
        operator_delete((void *)local_1548.type_._0_8_);
      }
      if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
          &local_1588.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
        operator_delete((void *)local_1588.type_._0_8_);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != 70000);
    LogicalType::ENUM((LogicalType *)local_1758,(Vector *)local_1710,70000);
    ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
    emplace_back<duckdb::LogicalType,char_const(&)[11]>
              ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
               (LogicalType *)local_1758,(char (*) [11])0x1dde57d);
    goto LAB_01163d0a;
  }
  LogicalType::LogicalType(&local_a08,VARCHAR);
  Vector::Vector((Vector *)local_1710,&local_a08,2);
  LogicalType::~LogicalType(&local_a08);
  local_1588.type_._0_8_ =
       &local_1588.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1588,"enum_","");
  pp_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> **)
            &local_1548.type_.type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_1548.type_._0_8_ = pp_Var4;
  ::std::__cxx11::string::_M_construct((ulong)&local_1548,'\x01');
  *(undefined1 *)(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)local_1548.type_._0_8_ = 0x30;
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (CONCAT44(local_1548.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                     _4_4_,(uint)local_1548.type_.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr) +
           CONCAT44(local_1588.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,(uint)local_1588.type_.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr));
  _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
      &local_1588.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    _Var16._M_pi = local_1588.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  }
  if (_Var16._M_pi < p_Var1) {
    _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1548.type_._0_8_ != pp_Var4) {
      _Var16._M_pi = local_1548.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    if (_Var16._M_pi < p_Var1) goto LAB_011639fb;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_1548,0,(char *)0x0,local_1588.type_._0_8_);
  }
  else {
LAB_011639fb:
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_1588,local_1548.type_._0_8_);
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar11) {
    local_1748[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_1748[0]._8_8_ = puVar6[3];
    local_1758._0_8_ = local_1748;
  }
  else {
    local_1748[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_1758._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar6;
  }
  local_1758._8_8_ = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  paVar11->_M_local_buf[0] = '\0';
  local_14c8 = (uint)local_1758._8_8_;
  if (local_14c8 < 0xd) {
    uStack_14bc = 0;
    uStack_14c4 = 0;
    uStack_14c0 = 0;
    if (local_14c8 != 0) {
      switchD_012dd528::default(&uStack_14c4,(void *)local_1758._0_8_,(ulong)(local_14c8 & 0xf));
    }
  }
  else {
    uStack_14c4 = *(undefined4 *)local_1758._0_8_;
    uStack_14c0 = (undefined4)local_1758._0_8_;
    uStack_14bc = SUB84(local_1758._0_8_,4);
  }
  data_02.value._4_1_ = (undefined1)uStack_14bc;
  data_02.value._5_1_ = uStack_14bc._1_1_;
  data_02.value._6_1_ = uStack_14bc._2_1_;
  data_02.value._7_1_ = uStack_14bc._3_1_;
  data_02.value.pointer.length = uStack_14c0;
  data_02.value.pointer.ptr = (char *)paVar11;
  aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)local_1710,(Vector *)CONCAT44(uStack_14c4,local_14c8),data_02)
  ;
  *(anon_struct_16_3_d7536bce_for_pointer *)local_16f0.bigint = aVar18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._0_8_ != local_1748) {
    operator_delete((void *)local_1758._0_8_);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1548.type_._0_8_ != pp_Var4) {
    operator_delete((void *)local_1548.type_._0_8_);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
      &local_1588.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_1588.type_._0_8_);
  }
  local_1588.type_._0_8_ =
       &local_1588.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1588,"enum_","");
  local_1548.type_._0_8_ = pp_Var4;
  ::std::__cxx11::string::_M_construct((ulong)&local_1548,'\x05');
  ::std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1548.type_._0_8_,5,69999);
  p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (CONCAT44(local_1548.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                     _4_4_,(uint)local_1548.type_.type_info_.internal.
                                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr) +
           CONCAT44(local_1588.type_.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,(uint)local_1588.type_.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr));
  _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
      &local_1588.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    _Var16._M_pi = local_1588.type_.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi;
  }
  if (_Var16._M_pi < p_Var1) {
    _Var16._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
    if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1548.type_._0_8_ != pp_Var4) {
      _Var16._M_pi = local_1548.type_.type_info_.internal.
                     super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
    }
    if (_Var16._M_pi < p_Var1) goto LAB_01163bc5;
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::replace
                       ((ulong)&local_1548,0,(char *)0x0,local_1588.type_._0_8_);
  }
  else {
LAB_01163bc5:
    puVar6 = (undefined8 *)
             ::std::__cxx11::string::_M_append((char *)&local_1588,local_1548.type_._0_8_);
  }
  paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(puVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 == paVar11) {
    local_1748[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_1748[0]._8_8_ = puVar6[3];
    local_1758._0_8_ = local_1748;
  }
  else {
    local_1748[0]._0_8_ = paVar11->_M_allocated_capacity;
    local_1758._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar6;
  }
  local_1758._8_8_ = puVar6[1];
  *puVar6 = paVar11;
  puVar6[1] = 0;
  paVar11->_M_local_buf[0] = '\0';
  local_14d8 = (uint)local_1758._8_8_;
  if (local_14d8 < 0xd) {
    uStack_14cc = 0;
    uStack_14d4 = 0;
    uStack_14d0 = 0;
    if (local_14d8 != 0) {
      switchD_012dd528::default(&uStack_14d4,(void *)local_1758._0_8_,(ulong)(local_14d8 & 0xf));
    }
  }
  else {
    uStack_14d4 = *(undefined4 *)local_1758._0_8_;
    uStack_14d0 = (undefined4)local_1758._0_8_;
    uStack_14cc = SUB84(local_1758._0_8_,4);
  }
  data_03.value._4_1_ = (undefined1)uStack_14cc;
  data_03.value._5_1_ = uStack_14cc._1_1_;
  data_03.value._6_1_ = uStack_14cc._2_1_;
  data_03.value._7_1_ = uStack_14cc._3_1_;
  data_03.value.pointer.length = uStack_14d0;
  data_03.value.pointer.ptr = (char *)paVar11;
  aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddStringOrBlob
                     ((StringVector *)local_1710,(Vector *)CONCAT44(uStack_14d4,local_14d8),data_03)
  ;
  ((anon_union_16_2_67f50693_for_value *)(local_16f0.bigint + 0x10))->pointer = aVar18;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._0_8_ != local_1748) {
    operator_delete((void *)local_1758._0_8_);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> **)local_1548.type_._0_8_ != pp_Var4) {
    operator_delete((void *)local_1548.type_._0_8_);
  }
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1588.type_._0_8_ !=
      &local_1588.type_.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
    operator_delete((void *)local_1588.type_._0_8_);
  }
  LogicalType::ENUM((LogicalType *)local_1758,(Vector *)local_1710,2);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType,char_const(&)[11]>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             (LogicalType *)local_1758,(char (*) [11])0x1dde57d);
LAB_01163d0a:
  psVar13 = &local_1708.type_info_;
  LogicalType::~LogicalType((LogicalType *)local_1758);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16b0[0]._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16b0[0]._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16d0._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_16d0._16_8_);
  }
  if (local_16d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_16d8._M_pi);
  }
  LogicalType::~LogicalType(&local_1708);
  LogicalType::LogicalType((LogicalType *)local_1710,INTEGER);
  LogicalType::LIST(&local_1508,(LogicalType *)local_1710);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1710,INTEGER);
  local_7e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_7e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_7e8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_1588,(LogicalType *)local_1710,&local_7e8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_7e8);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1758,INTEGER);
  Value::INTEGER((Value *)local_1710,0x2a);
  Value::INTEGER((Value *)local_16d0,999);
  LogicalType::LogicalType(&local_a38,INTEGER);
  Value::Value(&local_1690,&local_a38);
  LogicalType::LogicalType(&local_a50,INTEGER);
  Value::Value(&local_1650,&local_a50);
  Value::INTEGER(&local_1610,-0x2a);
  __l._M_len = 5;
  __l._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a20,__l,
             (allocator_type *)&local_270);
  Value::LIST(&local_1548,(LogicalType *)local_1758,&local_a20);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a20);
  lVar12 = 0x100;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_a50);
  LogicalType::~LogicalType(&local_a38);
  LogicalType::~LogicalType((LogicalType *)local_1758);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[10],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_1508,(char (*) [10])0x1dde4ec,&local_1588,&local_1548);
  LogicalType::LogicalType((LogicalType *)local_1710,DOUBLE);
  LogicalType::LIST(&local_a68,(LogicalType *)local_1710);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1710,DOUBLE);
  local_808.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_808.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_808.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_270,(LogicalType *)local_1710,&local_808);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_808);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1758,DOUBLE);
  Value::DOUBLE((Value *)local_1710,42.0);
  Value::DOUBLE((Value *)local_16d0,NAN);
  Value::DOUBLE(&local_1690,INFINITY);
  Value::DOUBLE(&local_1650,-INFINITY);
  LogicalType::LogicalType(&local_a98,DOUBLE);
  Value::Value(&local_1610,&local_a98);
  Value::DOUBLE(&local_15d0,-42.0);
  __l_00._M_len = 6;
  __l_00._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a80,__l_00,
             (allocator_type *)&local_2b0);
  Value::LIST(&local_70,(LogicalType *)local_1758,&local_a80);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_a80);
  lVar12 = 0x140;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_a98);
  LogicalType::~LogicalType((LogicalType *)local_1758);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[13],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_a68,(char (*) [13])"double_array",&local_270,&local_70);
  LogicalType::LogicalType((LogicalType *)local_1710,DATE);
  LogicalType::LIST(&local_ab0,(LogicalType *)local_1710);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1710,DATE);
  local_828.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_828.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_828.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_2b0,(LogicalType *)local_1710,&local_828);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_828);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType(&local_6d0.type_,DATE);
  Value::DATE((Value *)local_1710,(date_t)0x0);
  Value::DATE((Value *)local_16d0,(date_t)0x7fffffff);
  Value::DATE(&local_1690,(date_t)0x80000001);
  LogicalType::LogicalType(&local_ae0,DATE);
  Value::Value(&local_1650,&local_ae0);
  local_1758._0_8_ = local_1748;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1758,"2022-05-12","");
  value = Date::FromString((string *)local_1758,false);
  Value::DATE(&local_1610,value);
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ac8,__l_01,
             (allocator_type *)&local_2f0);
  Value::LIST(&local_b0,&local_6d0.type_,&local_ac8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ac8);
  lVar12 = 0x100;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._0_8_ != local_1748) {
    operator_delete((void *)local_1758._0_8_);
  }
  LogicalType::~LogicalType(&local_ae0);
  LogicalType::~LogicalType(&local_6d0.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[11],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_ab0,(char (*) [11])"date_array",&local_2b0,&local_b0);
  LogicalType::LogicalType((LogicalType *)local_1710,TIMESTAMP);
  LogicalType::LIST(&local_af8,(LogicalType *)local_1710);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1710,TIMESTAMP);
  local_848.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_848.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_848.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_6d0,(LogicalType *)local_1710,&local_848);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_848);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType(&local_710.type_,TIMESTAMP);
  Value::TIMESTAMP((Value *)local_1710,(timestamp_t)0x0);
  Value::TIMESTAMP((Value *)local_16d0,(timestamp_t)0x7fffffffffffffff);
  Value::TIMESTAMP(&local_1690,(timestamp_t)0x8000000000000001);
  LogicalType::LogicalType(&local_b28,TIMESTAMP);
  Value::Value(&local_1650,&local_b28);
  local_1758._0_8_ = local_1748;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1758,"2022-05-12 16:23:45","");
  value_00 = Timestamp::FromString((string *)local_1758);
  Value::TIMESTAMP(&local_1610,value_00);
  __l_02._M_len = 5;
  __l_02._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b10,__l_02,
             (allocator_type *)&local_330);
  Value::LIST(&local_2f0,&local_710.type_,&local_b10);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b10);
  lVar12 = 0x100;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._0_8_ != local_1748) {
    operator_delete((void *)local_1758._0_8_);
  }
  LogicalType::~LogicalType(&local_b28);
  LogicalType::~LogicalType(&local_710.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[16],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_af8,(char (*) [16])"timestamp_array",&local_6d0,&local_2f0);
  LogicalType::LogicalType((LogicalType *)local_1710,TIMESTAMP_TZ);
  LogicalType::LIST(&local_b40,(LogicalType *)local_1710);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1710,TIMESTAMP_TZ);
  local_868.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_868.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_868.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_710,(LogicalType *)local_1710,&local_868);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_868);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType(&local_750.type_,TIMESTAMP_TZ);
  Value::TIMESTAMPTZ((Value *)local_1710,(timestamp_tz_t)0x0);
  Value::TIMESTAMPTZ((Value *)local_16d0,(timestamp_tz_t)0x7fffffffffffffff);
  Value::TIMESTAMPTZ(&local_1690,(timestamp_tz_t)0x8000000000000001);
  LogicalType::LogicalType(&local_b70,TIMESTAMP_TZ);
  Value::Value(&local_1650,&local_b70);
  local_1758._0_8_ = local_1748;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1758,"2022-05-12 16:23:45-07","");
  value_01.super_timestamp_t.value = Timestamp::FromString((string *)local_1758);
  Value::TIMESTAMPTZ(&local_1610,value_01);
  __l_03._M_len = 5;
  __l_03._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b58,__l_03,
             (allocator_type *)&local_5f0);
  Value::LIST(&local_330,&local_750.type_,&local_b58);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b58);
  lVar12 = 0x100;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1758._0_8_ != local_1748) {
    operator_delete((void *)local_1758._0_8_);
  }
  LogicalType::~LogicalType(&local_b70);
  LogicalType::~LogicalType(&local_750.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[18],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_b40,(char (*) [18])"timestamptz_array",&local_710,&local_330);
  LogicalType::LogicalType((LogicalType *)local_1710,VARCHAR);
  LogicalType::LIST(&local_1220,(LogicalType *)local_1710);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1710,VARCHAR);
  local_888.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_888.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_888.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_750,(LogicalType *)local_1710,&local_888);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_888);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType((LogicalType *)local_1758,VARCHAR);
  Value::Value((Value *)local_1710,anon_var_dwarf_1ae4f39);
  Value::Value((Value *)local_16d0,"goose");
  LogicalType::LogicalType(&local_ba0,VARCHAR);
  Value::Value(&local_1690,&local_ba0);
  Value::Value(&local_1650,anon_var_dwarf_4f001a4 + 9);
  __l_04._M_len = 4;
  __l_04._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b88,__l_04,
             (allocator_type *)&local_370);
  Value::LIST(&local_5f0,(LogicalType *)local_1758,&local_b88);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_b88);
  lVar12 = 0xc0;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_ba0);
  LogicalType::~LogicalType((LogicalType *)local_1758);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[14],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_1220,(char (*) [14])0x1dde503,&local_750,&local_5f0);
  LogicalType::LIST(&local_bb8,&local_1508);
  local_8a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_8a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_370,&local_1508,&local_8a8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_8a8);
  Value::Value((Value *)local_1710,&local_1588);
  Value::Value((Value *)local_16d0,&local_1548);
  LogicalType::LogicalType(&local_be8,&local_1508);
  Value::Value(&local_1690,&local_be8);
  Value::Value(&local_1650,&local_1588);
  Value::Value(&local_1610,&local_1548);
  __l_05._M_len = 5;
  __l_05._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_bd0,__l_05,
             (allocator_type *)local_1758);
  Value::LIST(&local_f0,&local_1508,&local_bd0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_bd0);
  lVar12 = 0x100;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_be8);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_bb8,(char (*) [17])0x1dde4e5,&local_370,&local_f0);
  local_1328.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1328.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1328.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1758._0_8_ = "a";
  local_1758[8] = 0xd;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710,(pair<const_char_*,_duckdb::LogicalTypeId> *)local_1758);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&local_1328,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710);
  LogicalType::~LogicalType((LogicalType *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  local_1758._0_8_ = "b";
  local_1758[8] = 0x19;
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_*,_duckdb::LogicalTypeId,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710,(pair<const_char_*,_duckdb::LogicalTypeId> *)local_1758);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&local_1328,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710);
  LogicalType::~LogicalType((LogicalType *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_c00,&local_1328);
  LogicalType::STRUCT(&local_14b0,&local_c00);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_c00);
  local_1438.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1438.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1438.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_c18,INTEGER);
  Value::Value(&local_1260,&local_c18);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "a";
  Value::Value(pVVar8,&local_1260);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_1310);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1438,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_1260);
  LogicalType::~LogicalType(&local_c18);
  LogicalType::LogicalType(&local_c30,VARCHAR);
  Value::Value(&local_1260,&local_c30);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "b";
  Value::Value(pVVar8,&local_1260);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_1310);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1438,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_1260);
  LogicalType::~LogicalType(&local_c30);
  local_8c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1438.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1438.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1438.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1438.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1438.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1438.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&local_1260,(child_list_t<Value> *)&local_8c8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_8c8);
  local_1458.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1458.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1458.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::INTEGER(&local_1310,0x2a);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "a";
  Value::Value(pVVar8,&local_1310);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_12a0);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1458,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_1310);
  Value::Value(&local_1310,anon_var_dwarf_1ae4f39);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "b";
  Value::Value(pVVar8,&local_1310);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_12a0);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1458,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_1310);
  local_8e8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1458.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8e8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1458.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_8e8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1458.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1458.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1458.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1458.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&local_1310,(child_list_t<Value> *)&local_8e8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_8e8);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[7],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_14b0,(char (*) [7])0x1ddbbab,&local_1260,&local_1310);
  local_1348.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1348.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1348.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pLVar7 = (LogicalType *)(local_1758 + 8);
  local_1758._0_8_ = "a";
  LogicalType::LogicalType(pLVar7,&local_1508);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_12a0);
  LogicalType::LogicalType((LogicalType *)&local_16f0.hugeint,pLVar7);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&local_1348,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710);
  LogicalType::~LogicalType((LogicalType *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  LogicalType::~LogicalType(pLVar7);
  pLVar7 = (LogicalType *)(local_1758 + 8);
  local_1758._0_8_ = "b";
  LogicalType::LogicalType(pLVar7,&local_1220);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_12a0);
  LogicalType::LogicalType((LogicalType *)&local_16f0.hugeint,pLVar7);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
            ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
              *)&local_1348,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710);
  LogicalType::~LogicalType((LogicalType *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  LogicalType::~LogicalType(pLVar7);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_c60,&local_1348);
  LogicalType::STRUCT(&local_c48,&local_c60);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_c60);
  local_1478.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1478.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1478.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_c78,&local_1508);
  Value::Value(&local_12a0,&local_c78);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "a";
  Value::Value(pVVar8,&local_12a0);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_790);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1478,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_12a0);
  LogicalType::~LogicalType(&local_c78);
  LogicalType::LogicalType(&local_c90,&local_1220);
  Value::Value(&local_12a0,&local_c90);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "b";
  Value::Value(pVVar8,&local_12a0);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_790);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1478,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_12a0);
  LogicalType::~LogicalType(&local_c90);
  local_908.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1478.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_908.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1478.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_908.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1478.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1478.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1478.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1478.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&local_12a0,(child_list_t<Value> *)&local_908);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_908);
  local_1498.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1498.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1498.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "a";
  Value::Value(pVVar8,&local_1548);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_790);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1498,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "b";
  Value::Value(pVVar8,&local_5f0);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_790);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1498,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  local_928.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_1498.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_928.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_1498.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_928.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_1498.
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1498.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1498.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1498.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::STRUCT(&local_790,(child_list_t<Value> *)&local_928);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_928);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_c48,(char (*) [17])"struct_of_arrays",&local_12a0,&local_790);
  LogicalType::LIST(&local_ca8,&local_14b0);
  local_948.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_948.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_948.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::LIST(&local_130,&local_14b0,&local_948);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_948);
  Value::Value((Value *)local_1710,&local_1260);
  Value::Value((Value *)local_16d0,&local_1310);
  LogicalType::LogicalType(&local_cd8,&local_14b0);
  Value::Value(&local_1690,&local_cd8);
  __l_06._M_len = 3;
  __l_06._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_cc0,__l_06,
             (allocator_type *)local_1758);
  Value::LIST(&local_170,&local_14b0,&local_cc0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_cc0);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_cd8);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[17],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_ca8,(char (*) [17])"array_of_structs",&local_130,&local_170);
  LogicalType::LogicalType(&local_cf0,VARCHAR);
  LogicalType::LogicalType(&local_d08,VARCHAR);
  LogicalType::MAP(&local_12b8,&local_cf0,&local_d08);
  LogicalType::~LogicalType(&local_d08);
  LogicalType::~LogicalType(&local_cf0);
  pLVar7 = ListType::GetChildType(&local_12b8);
  local_968.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_968.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_968.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Value::MAP(&local_1b0,pLVar7,&local_968);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_968);
  local_1368.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1368.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1368.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::Value(&local_13e8,"key1");
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "key";
  Value::Value(pVVar8,&local_13e8);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_7d0);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1368,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_13e8);
  Value::Value(&local_13e8,anon_var_dwarf_1ae4f39);
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "value";
  Value::Value(pVVar8,&local_13e8);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_7d0);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1368,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_13e8);
  local_1388.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1388.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1388.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Value::Value(&local_13e8,"key2");
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "key";
  Value::Value(pVVar8,&local_13e8);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_7d0);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1388,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_13e8);
  Value::Value(&local_13e8,"goose");
  pVVar8 = (Value *)(local_1758 + 8);
  local_1758._0_8_ = "value";
  Value::Value(pVVar8,&local_13e8);
  ::std::__cxx11::string::string
            ((string *)local_1710,(char *)local_1758._0_8_,(allocator *)&local_7d0);
  Value::Value((Value *)&local_16f0.hugeint,pVVar8);
  ::std::
  vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
  ::emplace_back<std::pair<std::__cxx11::string,duckdb::Value>>
            ((vector<std::pair<std::__cxx11::string,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string,duckdb::Value>>>
              *)&local_1388,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710);
  Value::~Value((Value *)&local_16f0.hugeint);
  if (local_1710 != (undefined1  [8])psVar13) {
    operator_delete((void *)local_1710);
  }
  Value::~Value(pVVar8);
  Value::~Value(&local_13e8);
  local_13a8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13a8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13a8.super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_d20,&local_1368);
  Value::STRUCT((Value *)local_1710,(child_list_t<Value> *)&local_d20);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_13a8,
             (Value *)local_1710);
  Value::~Value((Value *)local_1710);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_d20);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_d38,&local_1388);
  Value::STRUCT((Value *)local_1710,(child_list_t<Value> *)&local_d38);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::emplace_back<duckdb::Value>
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_13a8,
             (Value *)local_1710);
  Value::~Value((Value *)local_1710);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_d38);
  pLVar7 = ListType::GetChildType(&local_12b8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d50,&local_13a8);
  Value::MAP((Value *)local_1758,pLVar7,&local_d50);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d50);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[4],duckdb::Value,duckdb::Value>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_12b8,(char (*) [4])0x1f1ce85,&local_1b0,(Value *)local_1758);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[5],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710,(char (*) [5])0x1dd9b3c,&LogicalType::VARCHAR);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[4],_const_duckdb::LogicalTypeId_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&local_16d8,(char (*) [4])0x1e4b274,&LogicalType::SMALLINT);
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)local_1710;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_12d0,__l_07,(allocator_type *)&local_13e8);
  lVar12 = -0x70;
  pLVar7 = (LogicalType *)(local_16d0 + 0x18);
  do {
    LogicalType::~LogicalType(pLVar7);
    p_Var1 = pLVar7[-2].type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pLVar7[-1].type_info_ != p_Var1) {
      operator_delete(p_Var1);
    }
    pLVar7 = (LogicalType *)
             &pLVar7[-3].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    lVar12 = lVar12 + 0x38;
  } while (lVar12 != 0);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_d80,&local_12d0);
  LogicalType::UNION(&local_d68,&local_d80);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_d80);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_d98,&local_12d0);
  Value::Value(&local_1f0,"Frank");
  Value::UNION(&local_13e8,&local_d98,'\0',&local_1f0);
  Value::~Value(&local_1f0);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_d98);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_db0,&local_12d0);
  Value::SMALLINT(&local_230,5);
  Value::UNION(&local_7d0,&local_db0,'\x01',&local_230);
  Value::~Value(&local_230);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_db0);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[6],duckdb::Value_const&,duckdb::Value_const&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_d68,(char (*) [6])0x1dd90de,&local_13e8,&local_7d0);
  LogicalType::LogicalType((LogicalType *)local_1710,INTEGER);
  LogicalType::ARRAY(&local_14f0,(LogicalType *)local_1710,(optional_idx)0x3);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType(&local_11a0.type_,INTEGER);
  LogicalType::LogicalType(&local_de0,INTEGER);
  Value::Value((Value *)local_1710,&local_de0);
  Value::Value((Value *)local_16d0,2);
  Value::Value(&local_1690,3);
  __l_08._M_len = 3;
  __l_08._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_dc8,__l_08,
             (allocator_type *)&local_1160);
  Value::ARRAY(&local_1078,&local_11a0.type_,&local_dc8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_dc8);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_de0);
  LogicalType::~LogicalType(&local_11a0.type_);
  LogicalType::LogicalType(&local_1160.type_,INTEGER);
  Value::Value((Value *)local_1710,4);
  Value::Value((Value *)local_16d0,5);
  Value::Value(&local_1690,6);
  __l_09._M_len = 3;
  __l_09._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_df8,__l_09,
             (allocator_type *)&local_1120);
  Value::ARRAY(&local_11a0,&local_1160.type_,&local_df8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_df8);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_1160.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[16],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_14f0,(char (*) [16])0x1dde55a,&local_1078,&local_11a0);
  LogicalType::LogicalType((LogicalType *)local_1710,VARCHAR);
  LogicalType::ARRAY(&local_1420,(LogicalType *)local_1710,(optional_idx)0x3);
  LogicalType::~LogicalType((LogicalType *)local_1710);
  LogicalType::LogicalType(&local_1120.type_,VARCHAR);
  Value::Value((Value *)local_1710,"a");
  LogicalType::LogicalType(&local_e28,VARCHAR);
  Value::Value((Value *)local_16d0,&local_e28);
  Value::Value(&local_1690,"c");
  __l_10._M_len = 3;
  __l_10._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e10,__l_10,
             (allocator_type *)&local_9a8);
  Value::ARRAY(&local_1160,&local_1120.type_,&local_e10);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e10);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_e28);
  LogicalType::~LogicalType(&local_1120.type_);
  LogicalType::LogicalType(&local_9a8.type_,VARCHAR);
  Value::Value((Value *)local_1710,"d");
  Value::Value((Value *)local_16d0,"e");
  Value::Value(&local_1690,"f");
  __l_11._M_len = 3;
  __l_11._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e40,__l_11,
             (allocator_type *)&local_630);
  Value::ARRAY(&local_1120,&local_9a8.type_,&local_e40);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e40);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_9a8.type_);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[20],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_1420,(char (*) [20])"fixed_varchar_array",&local_1160,&local_1120);
  LogicalType::ARRAY(&local_e58,&local_14f0,(optional_idx)0x3);
  Value::Value((Value *)local_1710,&local_1078);
  LogicalType::LogicalType(&local_e88,&local_14f0);
  Value::Value((Value *)local_16d0,&local_e88);
  Value::Value(&local_1690,&local_1078);
  __l_12._M_len = 3;
  __l_12._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e70,__l_12,
             (allocator_type *)&local_630);
  Value::ARRAY(&local_9a8,&local_14f0,&local_e70);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_e70);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_e88);
  Value::Value((Value *)local_1710,&local_11a0);
  Value::Value((Value *)local_16d0,&local_1078);
  Value::Value(&local_1690,&local_11a0);
  __l_13._M_len = 3;
  __l_13._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ea0,__l_13,
             (allocator_type *)&local_3b0);
  Value::ARRAY(&local_630,&local_14f0,&local_ea0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ea0);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[23],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_e58,(char (*) [23])"fixed_nested_int_array",&local_9a8,&local_630);
  LogicalType::ARRAY(&local_eb8,&local_1420,(optional_idx)0x3);
  Value::Value((Value *)local_1710,&local_1160);
  LogicalType::LogicalType(&local_ee8,&local_1420);
  Value::Value((Value *)local_16d0,&local_ee8);
  Value::Value(&local_1690,&local_1160);
  __l_14._M_len = 3;
  __l_14._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ed0,__l_14,
             (allocator_type *)&local_3f0);
  Value::ARRAY(&local_3b0,&local_1420,&local_ed0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ed0);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  LogicalType::~LogicalType(&local_ee8);
  Value::Value((Value *)local_1710,&local_1120);
  Value::Value((Value *)local_16d0,&local_1160);
  Value::Value(&local_1690,&local_1120);
  __l_15._M_len = 3;
  __l_15._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f00,__l_15,
             (allocator_type *)&local_430);
  Value::ARRAY(&local_3f0,&local_1420,&local_f00);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f00);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[27],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_eb8,(char (*) [27])"fixed_nested_varchar_array",&local_3b0,&local_3f0);
  LogicalType::ARRAY(&local_f18,&local_14b0,(optional_idx)0x3);
  Value::Value((Value *)local_1710,&local_1260);
  Value::Value((Value *)local_16d0,&local_1310);
  Value::Value(&local_1690,&local_1260);
  __l_16._M_len = 3;
  __l_16._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f30,__l_16,
             (allocator_type *)&local_470);
  Value::ARRAY(&local_430,&local_14b0,&local_f30);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f30);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  Value::Value((Value *)local_1710,&local_1310);
  Value::Value((Value *)local_16d0,&local_1260);
  Value::Value(&local_1690,&local_1310);
  __l_17._M_len = 3;
  __l_17._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f48,__l_17,
             (allocator_type *)&local_670);
  Value::ARRAY(&local_470,&local_14b0,&local_f48);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f48);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[19],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_f18,(char (*) [19])"fixed_struct_array",&local_430,&local_470);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[2],_duckdb::LogicalType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)local_1710,(char (*) [2])0x1dde3d5,&local_14f0);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
  ::pair<const_char_(&)[2],_duckdb::LogicalType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
              *)&local_16d8,(char (*) [2])0x1f1df56,&local_1420);
  __l_18._M_len = 2;
  __l_18._M_array = (iterator)local_1710;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            *)&local_f78,__l_18,(allocator_type *)&local_670);
  LogicalType::STRUCT(&local_f60,&local_f78);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_f78);
  lVar12 = -0x70;
  pLVar7 = (LogicalType *)(local_16d0 + 0x18);
  do {
    LogicalType::~LogicalType(pLVar7);
    p_Var1 = pLVar7[-2].type_info_.internal.
             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    ;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&pLVar7[-1].type_info_ != p_Var1) {
      operator_delete(p_Var1);
    }
    pLVar7 = (LogicalType *)
             &pLVar7[-3].type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    lVar12 = lVar12 + 0x38;
  } while (lVar12 != 0);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710,(char (*) [2])0x1dde3d5,&local_1078);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&local_16b0[0].hugeint,(char (*) [2])0x1f1df56,&local_1160);
  __l_19._M_len = 2;
  __l_19._M_array =
       (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
        *)local_1710;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_f90,__l_19,(allocator_type *)&local_4b0);
  Value::STRUCT(&local_670,(child_list_t<Value> *)&local_f90);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_f90);
  lVar12 = -0xc0;
  pVVar8 = &local_1690;
  do {
    Value::~Value(pVVar8);
    if (&pVVar8[-1].value_info_ !=
        (shared_ptr<duckdb::ExtraValueInfo,_true> *)pVVar8[-1].value_.bigint) {
      operator_delete((undefined1 *)pVVar8[-1].value_.bigint);
    }
    pVVar8 = (Value *)&pVVar8[-2].value_;
    lVar12 = lVar12 + 0x60;
  } while (lVar12 != 0);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)local_1710,(char (*) [2])0x1dde3d5,&local_11a0);
  ::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
  ::pair<const_char_(&)[2],_duckdb::Value_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>
              *)&local_16b0[0].hugeint,(char (*) [2])0x1f1df56,&local_1120);
  __l_20._M_len = 2;
  __l_20._M_array = (iterator)local_1710;
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::vector(&local_fa8,__l_20,(allocator_type *)&local_4f0);
  Value::STRUCT(&local_4b0,(child_list_t<Value> *)&local_fa8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_fa8);
  lVar12 = -0xc0;
  pVVar8 = &local_1690;
  do {
    Value::~Value(pVVar8);
    if (&pVVar8[-1].value_info_ !=
        (shared_ptr<duckdb::ExtraValueInfo,_true> *)pVVar8[-1].value_.bigint) {
      operator_delete((undefined1 *)pVVar8[-1].value_.bigint);
    }
    pVVar8 = (Value *)&pVVar8[-2].value_;
    lVar12 = lVar12 + 0x60;
  } while (lVar12 != 0);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[22],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_f60,(char (*) [22])"struct_of_fixed_array",&local_670,&local_4b0);
  LogicalType::ARRAY(&local_fc0,&local_1508,(optional_idx)0x3);
  Value::Value((Value *)local_1710,&local_1588);
  Value::Value((Value *)local_16d0,&local_1548);
  Value::Value(&local_1690,&local_1588);
  __l_21._M_len = 3;
  __l_21._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_fd8,__l_21,
             (allocator_type *)&local_530);
  Value::ARRAY(&local_4f0,&local_1508,&local_fd8);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_fd8);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  Value::Value((Value *)local_1710,&local_1548);
  Value::Value((Value *)local_16d0,&local_1588);
  Value::Value(&local_1690,&local_1548);
  __l_22._M_len = 3;
  __l_22._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ff0,__l_22,
             (allocator_type *)&local_570);
  Value::ARRAY(&local_530,&local_1508,&local_ff0);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_ff0);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[24],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_fc0,(char (*) [24])"fixed_array_of_int_list",&local_4f0,&local_530);
  LogicalType::LIST(&local_1008,&local_14f0);
  Value::Value((Value *)local_1710,&local_1078);
  Value::Value((Value *)local_16d0,&local_11a0);
  Value::Value(&local_1690,&local_1078);
  __l_23._M_len = 3;
  __l_23._M_array = (Value *)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1020,__l_23,
             (allocator_type *)&local_5b0);
  Value::LIST(&local_570,&local_14f0,&local_1020);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1020);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  Value::Value((Value *)local_1710,&local_11a0);
  Value::Value((Value *)local_16d0,&local_1078);
  Value::Value(&local_1690,&local_11a0);
  __l_24._M_len = 3;
  __l_24._M_array = (iterator)local_1710;
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1038,__l_24,&local_1589
            );
  Value::LIST(&local_5b0,&local_14f0,&local_1038);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1038);
  lVar12 = 0x80;
  do {
    Value::~Value((Value *)(local_1710 + lVar12));
    lVar12 = lVar12 + -0x40;
  } while (lVar12 != -0x40);
  ::std::vector<duckdb::TestType,std::allocator<duckdb::TestType>>::
  emplace_back<duckdb::LogicalType&,char_const(&)[24],duckdb::Value&,duckdb::Value&>
            ((vector<duckdb::TestType,std::allocator<duckdb::TestType>> *)__return_storage_ptr__,
             &local_1008,(char (*) [24])"list_of_fixed_int_array",&local_570,&local_5b0);
  Value::~Value(&local_5b0);
  Value::~Value(&local_570);
  LogicalType::~LogicalType(&local_1008);
  Value::~Value(&local_530);
  Value::~Value(&local_4f0);
  LogicalType::~LogicalType(&local_fc0);
  Value::~Value(&local_4b0);
  Value::~Value(&local_670);
  LogicalType::~LogicalType(&local_f60);
  Value::~Value(&local_470);
  Value::~Value(&local_430);
  LogicalType::~LogicalType(&local_f18);
  Value::~Value(&local_3f0);
  Value::~Value(&local_3b0);
  LogicalType::~LogicalType(&local_eb8);
  Value::~Value(&local_630);
  Value::~Value(&local_9a8);
  LogicalType::~LogicalType(&local_e58);
  Value::~Value(&local_1120);
  Value::~Value(&local_1160);
  LogicalType::~LogicalType(&local_1420);
  Value::~Value(&local_11a0);
  Value::~Value(&local_1078);
  LogicalType::~LogicalType(&local_14f0);
  Value::~Value(&local_7d0);
  Value::~Value(&local_13e8);
  LogicalType::~LogicalType(&local_d68);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_12d0);
  Value::~Value((Value *)local_1758);
  ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
            ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_13a8);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_1388);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_1368);
  Value::~Value(&local_1b0);
  LogicalType::~LogicalType(&local_12b8);
  Value::~Value(&local_170);
  Value::~Value(&local_130);
  LogicalType::~LogicalType(&local_ca8);
  Value::~Value(&local_790);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_1498);
  Value::~Value(&local_12a0);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_1478);
  LogicalType::~LogicalType(&local_c48);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_1348);
  Value::~Value(&local_1310);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_1458);
  Value::~Value(&local_1260);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>_>
  ::~vector(&local_1438);
  LogicalType::~LogicalType(&local_14b0);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_1328);
  Value::~Value(&local_f0);
  Value::~Value(&local_370);
  LogicalType::~LogicalType(&local_bb8);
  Value::~Value(&local_5f0);
  Value::~Value(&local_750);
  LogicalType::~LogicalType(&local_1220);
  Value::~Value(&local_330);
  Value::~Value(&local_710);
  LogicalType::~LogicalType(&local_b40);
  Value::~Value(&local_2f0);
  Value::~Value(&local_6d0);
  LogicalType::~LogicalType(&local_af8);
  Value::~Value(&local_b0);
  Value::~Value(&local_2b0);
  LogicalType::~LogicalType(&local_ab0);
  Value::~Value(&local_70);
  Value::~Value(&local_270);
  LogicalType::~LogicalType(&local_a68);
  Value::~Value(&local_1548);
  Value::~Value(&local_1588);
  LogicalType::~LogicalType(&local_1508);
  if (local_10e0.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_10e0.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_10e0.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_10e0.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_10e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_10e0.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
               .
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)((long)&local_10e0 + 8));
  if (local_11a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11a8._M_pi);
  }
  if (local_11b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11b8._M_pi);
  }
  if (local_11d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_11d0._M_pi);
  }
  LogicalType::~LogicalType((LogicalType *)(local_1208 + 8));
  return __return_storage_ptr__;
}

Assistant:

vector<TestType> TestAllTypesFun::GetTestTypes(bool use_large_enum) {
	vector<TestType> result;
	// scalar types/numerics
	result.emplace_back(LogicalType::BOOLEAN, "bool");
	result.emplace_back(LogicalType::TINYINT, "tinyint");
	result.emplace_back(LogicalType::SMALLINT, "smallint");
	result.emplace_back(LogicalType::INTEGER, "int");
	result.emplace_back(LogicalType::BIGINT, "bigint");
	result.emplace_back(LogicalType::HUGEINT, "hugeint");
	result.emplace_back(LogicalType::UHUGEINT, "uhugeint");
	result.emplace_back(LogicalType::UTINYINT, "utinyint");
	result.emplace_back(LogicalType::USMALLINT, "usmallint");
	result.emplace_back(LogicalType::UINTEGER, "uint");
	result.emplace_back(LogicalType::UBIGINT, "ubigint");
	result.emplace_back(LogicalType::VARINT, "varint");
	result.emplace_back(LogicalType::DATE, "date");
	result.emplace_back(LogicalType::TIME, "time");
	result.emplace_back(LogicalType::TIMESTAMP, "timestamp");
	result.emplace_back(LogicalType::TIMESTAMP_S, "timestamp_s");
	result.emplace_back(LogicalType::TIMESTAMP_MS, "timestamp_ms");
	result.emplace_back(LogicalType::TIMESTAMP_NS, "timestamp_ns");
	result.emplace_back(LogicalType::TIME_TZ, "time_tz");
	result.emplace_back(LogicalType::TIMESTAMP_TZ, "timestamp_tz");
	result.emplace_back(LogicalType::FLOAT, "float");
	result.emplace_back(LogicalType::DOUBLE, "double");
	result.emplace_back(LogicalType::DECIMAL(4, 1), "dec_4_1");
	result.emplace_back(LogicalType::DECIMAL(9, 4), "dec_9_4");
	result.emplace_back(LogicalType::DECIMAL(18, 6), "dec_18_6");
	result.emplace_back(LogicalType::DECIMAL(38, 10), "dec38_10");
	result.emplace_back(LogicalType::UUID, "uuid");

	// interval
	interval_t min_interval;
	min_interval.months = 0;
	min_interval.days = 0;
	min_interval.micros = 0;

	interval_t max_interval;
	max_interval.months = 999;
	max_interval.days = 999;
	max_interval.micros = 999999999;
	result.emplace_back(LogicalType::INTERVAL, "interval", Value::INTERVAL(min_interval),
	                    Value::INTERVAL(max_interval));
	// strings/blobs/bitstrings
	result.emplace_back(LogicalType::VARCHAR, "varchar", Value("🦆🦆🦆🦆🦆🦆"),
	                    Value(string("goo\x00se", 6)));
	result.emplace_back(LogicalType::BLOB, "blob", Value::BLOB("thisisalongblob\\x00withnullbytes"),
	                    Value::BLOB("\\x00\\x00\\x00a"));
	result.emplace_back(LogicalType::BIT, "bit", Value::BIT("0010001001011100010101011010111"), Value::BIT("10101"));

	// enums
	Vector small_enum(LogicalType::VARCHAR, 2);
	auto small_enum_ptr = FlatVector::GetData<string_t>(small_enum);
	small_enum_ptr[0] = StringVector::AddStringOrBlob(small_enum, "DUCK_DUCK_ENUM");
	small_enum_ptr[1] = StringVector::AddStringOrBlob(small_enum, "GOOSE");
	result.emplace_back(LogicalType::ENUM(small_enum, 2), "small_enum");

	Vector medium_enum(LogicalType::VARCHAR, 300);
	auto medium_enum_ptr = FlatVector::GetData<string_t>(medium_enum);
	for (idx_t i = 0; i < 300; i++) {
		medium_enum_ptr[i] = StringVector::AddStringOrBlob(medium_enum, string("enum_") + to_string(i));
	}
	result.emplace_back(LogicalType::ENUM(medium_enum, 300), "medium_enum");

	if (use_large_enum) {
		// this is a big one... not sure if we should push this one here, but it's required for completeness
		Vector large_enum(LogicalType::VARCHAR, 70000);
		auto large_enum_ptr = FlatVector::GetData<string_t>(large_enum);
		for (idx_t i = 0; i < 70000; i++) {
			large_enum_ptr[i] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(i));
		}
		result.emplace_back(LogicalType::ENUM(large_enum, 70000), "large_enum");
	} else {
		Vector large_enum(LogicalType::VARCHAR, 2);
		auto large_enum_ptr = FlatVector::GetData<string_t>(large_enum);
		large_enum_ptr[0] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(0));
		large_enum_ptr[1] = StringVector::AddStringOrBlob(large_enum, string("enum_") + to_string(69999));
		result.emplace_back(LogicalType::ENUM(large_enum, 2), "large_enum");
	}

	// arrays
	auto int_list_type = LogicalType::LIST(LogicalType::INTEGER);
	auto empty_int_list = Value::LIST(LogicalType::INTEGER, vector<Value>());
	auto int_list =
	    Value::LIST(LogicalType::INTEGER, {Value::INTEGER(42), Value::INTEGER(999), Value(LogicalType::INTEGER),
	                                       Value(LogicalType::INTEGER), Value::INTEGER(-42)});
	result.emplace_back(int_list_type, "int_array", empty_int_list, int_list);

	auto double_list_type = LogicalType::LIST(LogicalType::DOUBLE);
	auto empty_double_list = Value::LIST(LogicalType::DOUBLE, vector<Value>());
	auto double_list = Value::LIST(LogicalType::DOUBLE, {Value::DOUBLE(42), Value::DOUBLE(NAN),
	                                                     Value::DOUBLE(std::numeric_limits<double>::infinity()),
	                                                     Value::DOUBLE(-std::numeric_limits<double>::infinity()),
	                                                     Value(LogicalType::DOUBLE), Value::DOUBLE(-42)});
	result.emplace_back(double_list_type, "double_array", empty_double_list, double_list);

	auto date_list_type = LogicalType::LIST(LogicalType::DATE);
	auto empty_date_list = Value::LIST(LogicalType::DATE, vector<Value>());
	auto date_list = Value::LIST(LogicalType::DATE, {Value::DATE(date_t()), Value::DATE(date_t::infinity()),
	                                                 Value::DATE(date_t::ninfinity()), Value(LogicalType::DATE),
	                                                 Value::DATE(Date::FromString("2022-05-12"))});
	result.emplace_back(date_list_type, "date_array", empty_date_list, date_list);

	auto timestamp_list_type = LogicalType::LIST(LogicalType::TIMESTAMP);
	auto empty_timestamp_list = Value::LIST(LogicalType::TIMESTAMP, vector<Value>());
	auto timestamp_list =
	    Value::LIST(LogicalType::TIMESTAMP, {Value::TIMESTAMP(timestamp_t()), Value::TIMESTAMP(timestamp_t::infinity()),
	                                         Value::TIMESTAMP(timestamp_t::ninfinity()), Value(LogicalType::TIMESTAMP),
	                                         Value::TIMESTAMP(Timestamp::FromString("2022-05-12 16:23:45"))});
	result.emplace_back(timestamp_list_type, "timestamp_array", empty_timestamp_list, timestamp_list);

	auto timestamptz_list_type = LogicalType::LIST(LogicalType::TIMESTAMP_TZ);
	auto empty_timestamptz_list = Value::LIST(LogicalType::TIMESTAMP_TZ, vector<Value>());
	auto timestamptz_list =
	    Value::LIST(LogicalType::TIMESTAMP_TZ,
	                {Value::TIMESTAMPTZ(timestamp_tz_t()), Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_t::infinity())),
	                 Value::TIMESTAMPTZ(timestamp_tz_t(timestamp_t::ninfinity())), Value(LogicalType::TIMESTAMP_TZ),
	                 Value::TIMESTAMPTZ(timestamp_tz_t(Timestamp::FromString("2022-05-12 16:23:45-07")))});
	result.emplace_back(timestamptz_list_type, "timestamptz_array", empty_timestamptz_list, timestamptz_list);

	auto varchar_list_type = LogicalType::LIST(LogicalType::VARCHAR);
	auto empty_varchar_list = Value::LIST(LogicalType::VARCHAR, vector<Value>());
	auto varchar_list = Value::LIST(LogicalType::VARCHAR, {Value("🦆🦆🦆🦆🦆🦆"), Value("goose"),
	                                                       Value(LogicalType::VARCHAR), Value("")});
	result.emplace_back(varchar_list_type, "varchar_array", empty_varchar_list, varchar_list);

	// nested arrays
	auto nested_list_type = LogicalType::LIST(int_list_type);
	auto empty_nested_list = Value::LIST(int_list_type, vector<Value>());
	auto nested_int_list =
	    Value::LIST(int_list_type, {empty_int_list, int_list, Value(int_list_type), empty_int_list, int_list});
	result.emplace_back(nested_list_type, "nested_int_array", empty_nested_list, nested_int_list);

	// structs
	child_list_t<LogicalType> struct_type_list;
	struct_type_list.push_back(make_pair("a", LogicalType::INTEGER));
	struct_type_list.push_back(make_pair("b", LogicalType::VARCHAR));
	auto struct_type = LogicalType::STRUCT(struct_type_list);

	child_list_t<Value> min_struct_list;
	min_struct_list.push_back(make_pair("a", Value(LogicalType::INTEGER)));
	min_struct_list.push_back(make_pair("b", Value(LogicalType::VARCHAR)));
	auto min_struct_val = Value::STRUCT(std::move(min_struct_list));

	child_list_t<Value> max_struct_list;
	max_struct_list.push_back(make_pair("a", Value::INTEGER(42)));
	max_struct_list.push_back(make_pair("b", Value("🦆🦆🦆🦆🦆🦆")));
	auto max_struct_val = Value::STRUCT(std::move(max_struct_list));

	result.emplace_back(struct_type, "struct", min_struct_val, max_struct_val);

	// structs with lists
	child_list_t<LogicalType> struct_list_type_list;
	struct_list_type_list.push_back(make_pair("a", int_list_type));
	struct_list_type_list.push_back(make_pair("b", varchar_list_type));
	auto struct_list_type = LogicalType::STRUCT(struct_list_type_list);

	child_list_t<Value> min_struct_vl_list;
	min_struct_vl_list.push_back(make_pair("a", Value(int_list_type)));
	min_struct_vl_list.push_back(make_pair("b", Value(varchar_list_type)));
	auto min_struct_val_list = Value::STRUCT(std::move(min_struct_vl_list));

	child_list_t<Value> max_struct_vl_list;
	max_struct_vl_list.push_back(make_pair("a", int_list));
	max_struct_vl_list.push_back(make_pair("b", varchar_list));
	auto max_struct_val_list = Value::STRUCT(std::move(max_struct_vl_list));

	result.emplace_back(struct_list_type, "struct_of_arrays", std::move(min_struct_val_list),
	                    std::move(max_struct_val_list));

	// array of structs
	auto array_of_structs_type = LogicalType::LIST(struct_type);
	auto min_array_of_struct_val = Value::LIST(struct_type, vector<Value>());
	auto max_array_of_struct_val = Value::LIST(struct_type, {min_struct_val, max_struct_val, Value(struct_type)});
	result.emplace_back(array_of_structs_type, "array_of_structs", std::move(min_array_of_struct_val),
	                    std::move(max_array_of_struct_val));

	// map
	auto map_type = LogicalType::MAP(LogicalType::VARCHAR, LogicalType::VARCHAR);
	auto min_map_value = Value::MAP(ListType::GetChildType(map_type), vector<Value>());

	child_list_t<Value> map_struct1;
	map_struct1.push_back(make_pair("key", Value("key1")));
	map_struct1.push_back(make_pair("value", Value("🦆🦆🦆🦆🦆🦆")));
	child_list_t<Value> map_struct2;
	map_struct2.push_back(make_pair("key", Value("key2")));
	map_struct2.push_back(make_pair("value", Value("goose")));

	vector<Value> map_values;
	map_values.push_back(Value::STRUCT(map_struct1));
	map_values.push_back(Value::STRUCT(map_struct2));

	auto max_map_value = Value::MAP(ListType::GetChildType(map_type), map_values);
	result.emplace_back(map_type, "map", std::move(min_map_value), std::move(max_map_value));

	// union
	child_list_t<LogicalType> members = {{"name", LogicalType::VARCHAR}, {"age", LogicalType::SMALLINT}};
	auto union_type = LogicalType::UNION(members);
	const Value &min = Value::UNION(members, 0, Value("Frank"));
	const Value &max = Value::UNION(members, 1, Value::SMALLINT(5));
	result.emplace_back(union_type, "union", min, max);

	// fixed int array
	auto fixed_int_array_type = LogicalType::ARRAY(LogicalType::INTEGER, 3);
	auto fixed_int_min_array_value = Value::ARRAY(LogicalType::INTEGER, {Value(LogicalType::INTEGER), 2, 3});
	auto fixed_int_max_array_value = Value::ARRAY(LogicalType::INTEGER, {4, 5, 6});
	result.emplace_back(fixed_int_array_type, "fixed_int_array", fixed_int_min_array_value, fixed_int_max_array_value);

	// fixed varchar array
	auto fixed_varchar_array_type = LogicalType::ARRAY(LogicalType::VARCHAR, 3);
	auto fixed_varchar_min_array_value =
	    Value::ARRAY(LogicalType::VARCHAR, {Value("a"), Value(LogicalType::VARCHAR), Value("c")});
	auto fixed_varchar_max_array_value = Value::ARRAY(LogicalType::VARCHAR, {Value("d"), Value("e"), Value("f")});
	result.emplace_back(fixed_varchar_array_type, "fixed_varchar_array", fixed_varchar_min_array_value,
	                    fixed_varchar_max_array_value);

	// fixed nested int array
	auto fixed_nested_int_array_type = LogicalType::ARRAY(fixed_int_array_type, 3);
	auto fixed_nested_int_min_array_value = Value::ARRAY(
	    fixed_int_array_type, {fixed_int_min_array_value, Value(fixed_int_array_type), fixed_int_min_array_value});
	auto fixed_nested_int_max_array_value = Value::ARRAY(
	    fixed_int_array_type, {fixed_int_max_array_value, fixed_int_min_array_value, fixed_int_max_array_value});
	result.emplace_back(fixed_nested_int_array_type, "fixed_nested_int_array", fixed_nested_int_min_array_value,
	                    fixed_nested_int_max_array_value);

	// fixed nested varchar array
	auto fixed_nested_varchar_array_type = LogicalType::ARRAY(fixed_varchar_array_type, 3);
	auto fixed_nested_varchar_min_array_value =
	    Value::ARRAY(fixed_varchar_array_type,
	                 {fixed_varchar_min_array_value, Value(fixed_varchar_array_type), fixed_varchar_min_array_value});
	auto fixed_nested_varchar_max_array_value =
	    Value::ARRAY(fixed_varchar_array_type,
	                 {fixed_varchar_max_array_value, fixed_varchar_min_array_value, fixed_varchar_max_array_value});
	result.emplace_back(fixed_nested_varchar_array_type, "fixed_nested_varchar_array",
	                    fixed_nested_varchar_min_array_value, fixed_nested_varchar_max_array_value);

	// fixed array of structs
	auto fixed_struct_array_type = LogicalType::ARRAY(struct_type, 3);
	auto fixed_struct_min_array_value = Value::ARRAY(struct_type, {min_struct_val, max_struct_val, min_struct_val});
	auto fixed_struct_max_array_value = Value::ARRAY(struct_type, {max_struct_val, min_struct_val, max_struct_val});
	result.emplace_back(fixed_struct_array_type, "fixed_struct_array", fixed_struct_min_array_value,
	                    fixed_struct_max_array_value);

	// struct of fixed array
	auto struct_of_fixed_array_type =
	    LogicalType::STRUCT({{"a", fixed_int_array_type}, {"b", fixed_varchar_array_type}});
	auto struct_of_fixed_array_min_value =
	    Value::STRUCT({{"a", fixed_int_min_array_value}, {"b", fixed_varchar_min_array_value}});
	auto struct_of_fixed_array_max_value =
	    Value::STRUCT({{"a", fixed_int_max_array_value}, {"b", fixed_varchar_max_array_value}});
	result.emplace_back(struct_of_fixed_array_type, "struct_of_fixed_array", struct_of_fixed_array_min_value,
	                    struct_of_fixed_array_max_value);

	// fixed array of list of int
	auto fixed_array_of_list_of_int_type = LogicalType::ARRAY(int_list_type, 3);
	auto fixed_array_of_list_of_int_min_value = Value::ARRAY(int_list_type, {empty_int_list, int_list, empty_int_list});
	auto fixed_array_of_list_of_int_max_value = Value::ARRAY(int_list_type, {int_list, empty_int_list, int_list});
	result.emplace_back(fixed_array_of_list_of_int_type, "fixed_array_of_int_list",
	                    fixed_array_of_list_of_int_min_value, fixed_array_of_list_of_int_max_value);

	// list of fixed array of int
	auto list_of_fixed_array_of_int_type = LogicalType::LIST(fixed_int_array_type);
	auto list_of_fixed_array_of_int_min_value = Value::LIST(
	    fixed_int_array_type, {fixed_int_min_array_value, fixed_int_max_array_value, fixed_int_min_array_value});
	auto list_of_fixed_array_of_int_max_value = Value::LIST(
	    fixed_int_array_type, {fixed_int_max_array_value, fixed_int_min_array_value, fixed_int_max_array_value});
	result.emplace_back(list_of_fixed_array_of_int_type, "list_of_fixed_int_array",
	                    list_of_fixed_array_of_int_min_value, list_of_fixed_array_of_int_max_value);

	return result;
}